

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O0

void __thiscall Entity::setAndLoadMesh(Entity *this,string *filePath)

{
  Mesh *pMVar1;
  string local_48 [48];
  string *local_18;
  string *filePath_local;
  Entity *this_local;
  
  local_18 = filePath;
  filePath_local = (string *)this;
  if ((this->mesh != (Mesh *)0x0) && (pMVar1 = this->mesh, pMVar1 != (Mesh *)0x0)) {
    Mesh::~Mesh(pMVar1);
    operator_delete(pMVar1);
  }
  pMVar1 = (Mesh *)operator_new(0x10);
  Mesh::Mesh(pMVar1);
  this->mesh = pMVar1;
  pMVar1 = this->mesh;
  std::__cxx11::string::string(local_48,(string *)filePath);
  Mesh::loadObj(pMVar1,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void Entity::setAndLoadMesh(std::string filePath)
{
	if (mesh != NULL)
	{
		delete mesh;
	}

	mesh = new Mesh();
	mesh->loadObj(filePath);
}